

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::create_pipeline_int8_x86
          (ConvolutionDepthWise_x86_avx512 *this,Option *opt)

{
  uint _h;
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  Mat local_68;
  
  iVar8 = (this->super_ConvolutionDepthWise).kernel_h * (this->super_ConvolutionDepthWise).kernel_w;
  uVar7 = (this->super_ConvolutionDepthWise).num_output;
  _h = (this->super_ConvolutionDepthWise).group;
  uVar4 = (long)(this->super_ConvolutionDepthWise).weight_data_size / (long)(int)_h;
  uVar4 = (long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) / (long)iVar8;
  if ((_h == uVar7) &&
     (uVar7 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                   (long)((int)uVar7 / (int)_h)) * _h, uVar7 == _h)) {
    if (((uVar7 & 7) == 0 & opt->use_packing_layout) == 1) {
      Mat::reshape(&local_68,&(this->super_ConvolutionDepthWise).weight_data,iVar8,_h,
                   (Allocator *)0x0);
      convert_packing(&local_68,&this->weight_data_tm,8,opt);
      if (local_68.refcount != (int *)0x0) {
        LOCK();
        *local_68.refcount = *local_68.refcount + -1;
        UNLOCK();
        if (*local_68.refcount == 0) {
          if (local_68.allocator == (Allocator *)0x0) {
            if (local_68.data != (void *)0x0) {
              free(local_68.data);
            }
          }
          else {
            (*(local_68.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      piVar1 = (this->super_ConvolutionDepthWise).weight_data.refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = (this->weight_data_tm).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar2 = (this->weight_data_tm).data;
          pAVar3 = (this->weight_data_tm).allocator;
          if (pAVar3 == (Allocator *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (*pAVar3->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
      (this->weight_data_tm).data = (void *)0x0;
      (this->weight_data_tm).refcount = (int *)0x0;
      piVar1 = (this->super_ConvolutionDepthWise).weight_data.refcount;
      (this->weight_data_tm).data = (this->super_ConvolutionDepthWise).weight_data.data;
      (this->weight_data_tm).refcount = piVar1;
      (this->weight_data_tm).elemsize = (this->super_ConvolutionDepthWise).weight_data.elemsize;
      (this->weight_data_tm).elempack = (this->super_ConvolutionDepthWise).weight_data.elempack;
      (this->weight_data_tm).allocator = (this->super_ConvolutionDepthWise).weight_data.allocator;
      iVar8 = (this->super_ConvolutionDepthWise).weight_data.w;
      iVar5 = (this->super_ConvolutionDepthWise).weight_data.h;
      iVar6 = (this->super_ConvolutionDepthWise).weight_data.d;
      (this->weight_data_tm).dims = (this->super_ConvolutionDepthWise).weight_data.dims;
      (this->weight_data_tm).w = iVar8;
      (this->weight_data_tm).h = iVar5;
      (this->weight_data_tm).d = iVar6;
      (this->weight_data_tm).c = (this->super_ConvolutionDepthWise).weight_data.c;
      (this->weight_data_tm).cstep = (this->super_ConvolutionDepthWise).weight_data.cstep;
    }
  }
  else {
    create_group_ops(this,opt);
  }
  if (opt->lightmode == true) {
    piVar1 = (this->super_ConvolutionDepthWise).weight_data.refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->super_ConvolutionDepthWise).weight_data.data;
        pAVar3 = (this->super_ConvolutionDepthWise).weight_data.allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_ConvolutionDepthWise).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_ConvolutionDepthWise).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_ConvolutionDepthWise).weight_data.elemsize + 4) = 0;
    (this->super_ConvolutionDepthWise).weight_data.data = (void *)0x0;
    (this->super_ConvolutionDepthWise).weight_data.refcount = (int *)0x0;
    (this->super_ConvolutionDepthWise).weight_data.dims = 0;
    (this->super_ConvolutionDepthWise).weight_data.w = 0;
    (this->super_ConvolutionDepthWise).weight_data.h = 0;
    (this->super_ConvolutionDepthWise).weight_data.d = 0;
    (this->super_ConvolutionDepthWise).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            elempack = channels % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__

        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }

        if (elempack == 1)
        {
            weight_data_tm = weight_data;
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}